

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpegd_vdpu2.c
# Opt level: O1

MPP_RET hal_jpegd_vdpu2_control(void *hal,MpiCmd cmd_type,void *param)

{
  uint uVar1;
  MPP_RET MVar2;
  
  if (((byte)jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"HAL_JPEG_VDPU2","enter\n","hal_jpegd_vdpu2_control");
  }
  if (hal == (void *)0x0) {
    _mpp_log_l(2,"HAL_JPEG_VDPU2","NULL pointer","hal_jpegd_vdpu2_control");
    MVar2 = MPP_ERR_NULL_PTR;
  }
  else {
    MVar2 = MPP_OK;
    if (cmd_type == MPP_DEC_SET_OUTPUT_FORMAT) {
      *(undefined4 *)((long)hal + 0x90) = *param;
      *(undefined4 *)((long)hal + 0x94) = 1;
      if (((byte)jpegd_debug & 0x80) != 0) {
        _mpp_log_l(4,"HAL_JPEG_VDPU2","output_format: 0x%x\n",(char *)0x0);
      }
      uVar1 = *(uint *)((long)hal + 0x90);
      MVar2 = MPP_OK;
      if (((uVar1 & 0xf0000) != 0 || 0x13 < (uVar1 & 0xfffc)) &&
         ((uVar1 & 0xf0000) != 0x10000 || 0x1000f < (uVar1 & 0x1fff0))) {
        _mpp_log_l(2,"HAL_JPEG_VDPU2","invalid output format 0x%x\n","hal_jpegd_vdpu2_control");
        MVar2 = MPP_ERR_VALUE;
      }
    }
    if (((byte)jpegd_debug & 1) != 0) {
      _mpp_log_l(4,"HAL_JPEG_VDPU2","exit ret %d\n","hal_jpegd_vdpu2_control",(ulong)(uint)MVar2);
    }
  }
  return MVar2;
}

Assistant:

MPP_RET hal_jpegd_vdpu2_control(void *hal, MpiCmd cmd_type,
                                void *param)
{
    jpegd_dbg_func("enter\n");
    MPP_RET ret = MPP_OK;
    JpegdHalCtx *JpegHalCtx = (JpegdHalCtx *)hal;
    if (NULL == JpegHalCtx) {
        mpp_err_f("NULL pointer");
        return MPP_ERR_NULL_PTR;
    }

    switch (cmd_type) {
    case MPP_DEC_SET_OUTPUT_FORMAT: {
        JpegHalCtx->output_fmt = *((MppFrameFormat *)param);
        JpegHalCtx->set_output_fmt_flag = 1;
        jpegd_dbg_hal("output_format: 0x%x\n", JpegHalCtx->output_fmt);

        if (!MPP_FRAME_FMT_IS_YUV(JpegHalCtx->output_fmt) && !MPP_FRAME_FMT_IS_RGB(JpegHalCtx->output_fmt)) {
            mpp_err_f("invalid output format 0x%x\n", JpegHalCtx->output_fmt);
            ret = MPP_ERR_VALUE;
        }
    } break;
    default :
        break;
    }

    jpegd_dbg_func("exit ret %d\n", ret);
    return  ret;
}